

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

int * __thiscall Image::histogram(Image *this)

{
  int iVar1;
  uint uVar2;
  int **ppiVar3;
  int *piVar4;
  int *__s;
  long lVar5;
  ulong uVar6;
  
  __s = (int *)operator_new__(0x400);
  memset(__s,0,0x400);
  iVar1 = this->row;
  if (0 < (long)iVar1) {
    uVar2 = this->col;
    ppiVar3 = this->matrix;
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        piVar4 = ppiVar3[lVar5];
        uVar6 = 0;
        do {
          __s[piVar4[uVar6]] = __s[piVar4[uVar6]] + 1;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return __s;
}

Assistant:

int *Image::histogram()
{
    auto h = new int[256];

    for(int i=0; i<=255; ++i)
        h[i] = 0;
    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            h[matrix[i][j]]++;
        }
    }
    return h;
}